

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_queued_task.h
# Opt level: O2

void __thiscall
dd::
ClosureTask<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc:71:12)>
::~ClosureTask(ClosureTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_connection_cc:71:12)>
               *this)

{
  (this->super_QueuedTask)._vptr_QueuedTask = (_func_int **)&PTR__ClosureTask_00137770;
  std::__cxx11::string::~string((string *)&(this->_closure).ip);
  return;
}

Assistant:

explicit ClosureTask(Closure&& closure) :_closure(std::forward<Closure>(closure)) {}